

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.h
# Opt level: O1

void __thiscall
google::protobuf::io::IstreamInputStream::~IstreamInputStream(IstreamInputStream *this)

{
  CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&this->impl_);
  operator_delete(this,0x50);
  return;
}

Assistant:

class PROTOBUF_EXPORT IstreamInputStream final : public ZeroCopyInputStream {
 public:
  // Creates a stream that reads from the given C++ istream.
  // If a block_size is given, it specifies the number of bytes that
  // should be read and returned with each call to Next().  Otherwise,
  // a reasonable default is used.
  explicit IstreamInputStream(std::istream* stream, int block_size = -1);
  IstreamInputStream(const IstreamInputStream&) = delete;
  IstreamInputStream& operator=(const IstreamInputStream&) = delete;

  // implements ZeroCopyInputStream ----------------------------------
  bool Next(const void** data, int* size) override;
  void BackUp(int count) override;
  bool Skip(int count) override;
  int64_t ByteCount() const override;

 private:
  class PROTOBUF_EXPORT CopyingIstreamInputStream final
      : public CopyingInputStream {
   public:
    explicit CopyingIstreamInputStream(std::istream* input);
    CopyingIstreamInputStream(const CopyingIstreamInputStream&) = delete;
    CopyingIstreamInputStream& operator=(const CopyingIstreamInputStream&) =
        delete;
    ~CopyingIstreamInputStream() override;

    // implements CopyingInputStream ---------------------------------
    int Read(void* buffer, int size) override;
    // (We use the default implementation of Skip().)

   private:
    // The stream.
    std::istream* input_;
  }